

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

int sort_typeBstar(uchar *T,int *SA,int *bucket_A,int *bucket_B,int n,int openMP)

{
  uint *puVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  uint *puVar10;
  ushort uVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  int iVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong uVar18;
  byte bVar19;
  uint uVar20;
  uint *puVar21;
  int iVar22;
  uint uVar23;
  int *piVar24;
  ulong uVar25;
  uint *puVar26;
  ulong uVar27;
  uint *puVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  byte *pbVar33;
  long lVar34;
  uchar *puVar35;
  uint uVar36;
  int iVar37;
  uchar *puVar38;
  int iVar39;
  int *piVar40;
  uint *puVar41;
  uint *puVar42;
  uint uVar43;
  uint uVar44;
  byte bVar45;
  uint uVar46;
  uint uVar47;
  byte *pbVar48;
  byte *pbVar49;
  byte *pbVar50;
  ulong uVar51;
  int iVar52;
  bool bVar53;
  bool bVar54;
  anon_struct_32_5_90aca025 stack [64];
  int in_stack_fffffffffffff6c0;
  uint local_92c;
  uint *local_918;
  uint *local_8d8;
  uint *local_8d0;
  uint *local_8c8;
  uint *local_8c0;
  ulong local_8b8;
  ulong local_8b0;
  uint *local_8a8;
  uint *local_8a0;
  byte *local_898;
  uint *local_890;
  ulong local_888;
  int *local_880;
  uint *local_878;
  uint *local_870;
  uint *local_868;
  uint *local_860;
  long local_858;
  uint *local_850;
  ulong local_848 [2];
  int local_838 [6];
  uint auStack_820 [2];
  undefined8 auStack_818 [3];
  uint auStack_800 [500];
  
  uVar16 = (ulong)(uint)n;
  iVar15 = 0;
  local_880 = bucket_A;
  memset(bucket_A,0,0x400);
  memset(bucket_B,0,0x40000);
  uVar7 = n - 1;
  local_848[0] = (ulong)uVar7;
  uVar3 = n;
  if (0 < n) {
    uVar32 = (ulong)T[local_848[0]];
    uVar31 = uVar16;
    while( true ) {
      uVar3 = (uint)uVar31;
      iVar22 = -uVar7;
      uVar31 = (ulong)uVar7;
      do {
        uVar7 = uVar7 - 1;
        uVar27 = (ulong)uVar7;
        local_880[uVar32] = local_880[uVar32] + 1;
        if (uVar31 == 0) goto LAB_0019ebb6;
        bVar19 = T[uVar31 - 1];
        iVar22 = iVar22 + 1;
        uVar4 = (uint)uVar32;
        uVar32 = (ulong)bVar19;
        uVar31 = uVar31 - 1;
      } while (uVar4 <= bVar19);
      bucket_B[(uint)bVar19 << 8 | uVar4] = bucket_B[(uint)bVar19 << 8 | uVar4] + 1;
      lVar30 = (long)(int)uVar3;
      uVar3 = uVar3 - 1;
      uVar31 = (ulong)uVar3;
      SA[lVar30 + -1] = -iVar22;
      uVar25 = (ulong)bVar19;
      if (1 - iVar22 < 2) break;
      while( true ) {
        iVar22 = (int)uVar27;
        uVar7 = iVar22 - 1;
        uVar27 = (ulong)uVar7;
        bVar19 = T[uVar27];
        uVar32 = (ulong)bVar19;
        if ((uint)uVar25 < (uint)bVar19) break;
        bucket_B[(uint)uVar25 << 8 | (uint)bVar19] = bucket_B[(uint)uVar25 << 8 | (uint)bVar19] + 1;
        uVar25 = uVar32;
        if ((int)uVar7 < 1) goto LAB_0019ebb6;
      }
      uVar7 = iVar22 - 1;
    }
  }
LAB_0019ebb6:
  piVar9 = bucket_B + 0x100;
  uVar31 = 0;
  iVar22 = 0;
  piVar24 = bucket_B;
  do {
    iVar52 = local_880[uVar31];
    local_880[uVar31] = iVar15 + iVar22;
    iVar15 = iVar52 + iVar15 + bucket_B[(uint)((int)uVar31 << 8) | uVar31];
    if (uVar31 < 0xff) {
      lVar30 = 1;
      piVar40 = piVar9;
      do {
        iVar22 = iVar22 + piVar24[lVar30];
        piVar24[lVar30] = iVar22;
        iVar15 = iVar15 + *piVar40;
        piVar40 = piVar40 + 0x100;
        lVar12 = uVar31 + lVar30;
        lVar30 = lVar30 + 1;
      } while (lVar12 != 0xff);
    }
    uVar31 = uVar31 + 1;
    piVar9 = piVar9 + 0x101;
    piVar24 = piVar24 + 0x101;
  } while (uVar31 != 0x100);
  uVar7 = n - uVar3;
  puVar10 = (uint *)(ulong)uVar7;
  if (uVar7 != 0 && (int)uVar3 <= n) {
    piVar9 = SA + (uVar16 - (long)puVar10);
    if (uVar7 != 1) {
      uVar31 = (ulong)(uVar7 - 2);
      iVar15 = ~uVar3 + n;
      do {
        uVar11 = *(ushort *)(T + piVar9[uVar31]) << 8 | *(ushort *)(T + piVar9[uVar31]) >> 8;
        iVar22 = bucket_B[uVar11];
        bucket_B[uVar11] = iVar22 + -1;
        SA[(long)iVar22 + -1] = (int)uVar31;
        uVar31 = uVar31 - 1;
        iVar15 = iVar15 + -1;
      } while (0 < iVar15);
    }
    puVar1 = (uint *)(SA + (long)puVar10);
    uVar31 = (ulong)(uVar7 - 1);
    uVar11 = *(ushort *)(T + piVar9[uVar31]) << 8 | *(ushort *)(T + piVar9[uVar31]) >> 8;
    iVar15 = bucket_B[uVar11];
    bucket_B[uVar11] = iVar15 + -1;
    SA[(long)iVar15 + -1] = uVar7 - 1;
    iVar22 = n + uVar7 * -2;
    local_848[1] = (ulong)iVar22;
    pbVar48 = T + n;
    iVar15 = 0xfe;
    local_92c = uVar7;
    local_8b0 = uVar16;
    local_8a0 = (uint *)SA;
    local_898 = pbVar48;
    local_888 = uVar31;
    local_850 = puVar10;
    do {
      local_868 = (uint *)CONCAT44(local_868._4_4_,iVar15 << 8);
      uVar3 = 0xff;
      local_860 = (uint *)CONCAT44(local_860._4_4_,iVar15);
      do {
        local_858 = CONCAT44(local_858._4_4_,uVar3);
        uVar4 = bucket_B[(int)(uVar3 | (uint)local_868)];
        if (1 < (int)(local_92c - uVar4)) {
          local_878 = local_8a0 + (int)uVar4;
          local_870 = (uint *)CONCAT44(local_870._4_4_,*local_878);
          local_890 = local_8a0 + (long)(int)uVar4 + 1;
          local_8c0 = local_878;
          if (*local_878 == (uint)uVar31) {
            local_8c0 = local_890;
          }
          puVar41 = local_8a0 + (int)local_92c;
          puVar21 = puVar41;
          local_8d0 = puVar1;
          if (iVar22 < 0x400) {
            uVar16 = (long)puVar41 - (long)local_8c0 >> 2;
            if ((long)uVar16 <= (long)local_848[1]) goto LAB_0019ee3a;
            iVar15 = 0x400;
            uVar3 = (uint)uVar16;
            if ((int)uVar3 < 0x100000) {
              if (uVar3 < 0x10000) {
                if (uVar3 < 0x100) {
                  uVar29 = lg_table[uVar16 & 0xff];
                }
                else {
                  uVar29 = lg_table[uVar16 >> 8 & 0xff] + 8;
                }
              }
              else if (uVar3 < 0x1000000) {
                uVar29 = *(int *)((long)lg_table + (ulong)(uVar3 >> 0xe & 0x3fc)) + 0x10;
              }
              else {
                uVar29 = lg_table[uVar3 >> 0x18] + 0x18;
              }
              if ((int)uVar29 < 0x10) {
                if ((int)uVar29 < 8) {
                  iVar15 = sqq_table[(int)((ulong)((long)puVar41 - (long)local_8c0) >> 2)] >> 4;
                  goto LAB_0019f4a7;
                }
                iVar15 = (sqq_table[(int)uVar3 >> (((byte)uVar29 & 0xfe) - 6 & 0x1f)] >>
                         (7U - (char)(uVar29 >> 1) & 0x1f)) + 1;
              }
              else {
                iVar15 = sqq_table[(int)uVar3 >> (((byte)uVar29 & 0xfe) - 6 & 0x1f)] <<
                         ((char)(uVar29 >> 1) - 7U & 0x1f);
                if (0x17 < uVar29) {
                  iVar15 = iVar15 + (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                                                uVar16 & 0xffffffff) / (long)iVar15) + 1 >> 1;
                }
                iVar15 = iVar15 + (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                                              uVar16 & 0xffffffff) / (long)iVar15) + 1 >> 1;
              }
              iVar15 = iVar15 - (uint)((int)uVar3 < iVar15 * iVar15);
            }
LAB_0019f4a7:
            local_8a8 = (uint *)CONCAT71(local_8a8._1_7_,1);
            local_8b8 = CONCAT44(local_8b8._4_4_,iVar22);
            if (iVar22 < iVar15) {
              iVar52 = 0x400;
              if (iVar15 < 0x400) {
                iVar52 = iVar15;
              }
              local_8b8 = CONCAT44(local_8b8._4_4_,iVar52);
              local_8a8 = (uint *)CONCAT71(local_8a8._1_7_,iVar15 == 0);
              puVar21 = puVar41 + -(long)iVar52;
              local_8d0 = puVar41 + -(long)iVar52;
            }
          }
          else {
LAB_0019ee3a:
            local_8a8 = (uint *)CONCAT71(local_8a8._1_7_,1);
            local_8b8 = CONCAT44(local_8b8._4_4_,iVar22);
          }
          if ((long)puVar21 - (long)local_8c0 < 0x1001) {
            puVar5 = local_8a0;
            ss_mintrosort(T,piVar9,(int *)local_8c0,(int *)puVar21,(int)local_8a0);
            iVar15 = (int)puVar5;
          }
          else {
            uVar16 = 0;
            puVar13 = local_8c0;
            puVar5 = local_8a0;
            do {
              local_918 = puVar13 + 0x400;
              ss_mintrosort(T,piVar9,(int *)puVar13,(int *)local_918,(int)puVar5);
              iVar15 = (int)((ulong)((long)puVar41 - (long)local_918) >> 2);
              puVar6 = local_8d0;
              if ((int)local_8b8 < iVar15) {
                puVar6 = local_918;
              }
              if (iVar15 < (int)local_8b8) {
                iVar15 = (int)local_8b8;
              }
              if ((uVar16 & 1) != 0) {
                iVar52 = 0x400;
                uVar3 = (uint)uVar16;
                do {
                  lVar30 = (long)iVar52;
                  puVar5 = puVar13 + lVar30;
                  ss_swapmerge(T,piVar9,(int *)(puVar13 + -lVar30),(int *)puVar13,(int *)puVar5,
                               (int *)puVar6,iVar15,in_stack_fffffffffffff6c0);
                  iVar52 = iVar52 * 2;
                  uVar29 = uVar3 & 2;
                  puVar13 = puVar13 + -lVar30;
                  uVar3 = uVar3 >> 1;
                } while (uVar29 != 0);
              }
              uVar16 = (ulong)((uint)uVar16 + 1);
              puVar13 = local_918;
            } while (0x1000 < (long)puVar21 - (long)local_918);
            ss_mintrosort(T,piVar9,(int *)local_918,(int *)puVar21,(int)puVar5);
            pbVar48 = local_898;
            iVar52 = 0x400;
            do {
              if ((uVar16 & 1) != 0) {
                puVar5 = puVar21;
                ss_swapmerge(T,piVar9,(int *)(local_918 + -(long)iVar52),(int *)local_918,
                             (int *)puVar21,(int *)local_8d0,(int)local_8b8,
                             in_stack_fffffffffffff6c0);
                local_918 = local_918 + -(long)iVar52;
              }
              iVar15 = (int)puVar5;
              iVar52 = iVar52 * 2;
              uVar3 = (uint)uVar16;
              uVar16 = uVar16 >> 1;
            } while (1 < uVar3);
          }
          if ((char)local_8a8 == '\0') {
            ss_mintrosort(T,piVar9,(int *)puVar21,(int *)puVar41,iVar15);
            puVar5 = puVar41;
            do {
              uVar3 = puVar5[-1];
              uVar16 = (ulong)((long)puVar21 - (long)local_8c0) >> 2;
              puVar13 = local_8c0;
              if ((int)uVar16 < 1) {
                if (local_8c0 < puVar21) goto LAB_0019f155;
              }
              else {
                uVar31 = (ulong)((int)uVar3 >> 0x1f ^ uVar3);
                lVar30 = (long)piVar9[uVar31];
                pbVar48 = T + lVar30 + 2;
                pbVar33 = T + (long)piVar9[uVar31 + 1] + 2;
                uVar29 = 0xffffffff;
                do {
                  uVar31 = uVar16 >> 1 & 0x7fffffff;
                  uVar32 = (ulong)((int)puVar13[uVar31] >> 0x1f ^ puVar13[uVar31]);
                  lVar12 = (long)piVar9[uVar32];
                  pbVar50 = T + lVar12 + 2;
                  bVar53 = pbVar50 < T + (long)piVar9[uVar32 + 1] + 2;
                  pbVar17 = pbVar48;
                  bVar54 = pbVar48 < pbVar33;
                  if ((bVar53) && (puVar35 = T, pbVar48 < pbVar33)) {
                    do {
                      bVar19 = puVar35[lVar12 + 2];
                      bVar45 = puVar35[lVar30 + 2];
                      if (bVar19 != bVar45) goto LAB_0019f0ee;
                      pbVar49 = puVar35 + lVar30 + 3;
                      puVar38 = puVar35 + 1;
                      bVar53 = puVar35 + lVar12 + 3 < T + (long)piVar9[uVar32 + 1] + 2;
                    } while ((bVar53) && (puVar35 = puVar38, pbVar49 < pbVar33));
                    pbVar50 = puVar38 + lVar12 + 2;
                    pbVar17 = puVar38 + lVar30 + 2;
                    bVar54 = pbVar49 < pbVar33;
                  }
                  if (bVar53) {
                    uVar20 = 1;
                    if (bVar54 != false) {
                      bVar19 = *pbVar50;
                      bVar45 = *pbVar17;
LAB_0019f0ee:
                      uVar20 = (uint)bVar19 - (uint)bVar45;
                    }
                  }
                  else {
                    uVar20 = -(uint)bVar54;
                  }
                  uVar36 = uVar20 >> 0x1f & ~(uint)uVar16;
                  puVar6 = puVar13 + uVar31 + 1;
                  if (-1 < (int)uVar20) {
                    puVar6 = puVar13;
                    uVar29 = uVar20;
                  }
                  puVar13 = puVar6;
                  uVar20 = (uint)uVar31 - uVar36;
                  uVar16 = (ulong)uVar20;
                } while (uVar20 != 0 && uVar36 <= (uint)uVar31);
                pbVar48 = local_898;
                if (puVar13 < puVar21) {
                  if (uVar29 == 0) {
                    *puVar13 = ~*puVar13;
                  }
LAB_0019f155:
                  uVar16 = (ulong)((long)puVar21 - (long)puVar13) >> 2;
                  if ((0 < (int)uVar16) &&
                     (uVar31 = (ulong)((long)puVar5 - (long)puVar21) >> 2, 0 < (int)uVar31)) {
                    puVar6 = puVar13;
                    puVar14 = puVar5;
LAB_0019f18b:
                    uVar20 = (uint)uVar16;
                    uVar29 = (uint)uVar31;
                    if (uVar20 != uVar29) goto code_r0x0019f194;
                    uVar29 = uVar29 + 1;
                    lVar30 = 0;
                    do {
                      uVar2 = *(undefined4 *)((long)puVar6 + lVar30);
                      *(undefined4 *)((long)puVar6 + lVar30) =
                           *(undefined4 *)((long)puVar21 + lVar30);
                      *(undefined4 *)((long)puVar21 + lVar30) = uVar2;
                      lVar30 = lVar30 + 4;
                      uVar29 = uVar29 - 1;
                    } while (1 < uVar29);
                  }
LAB_0019f252:
                  if (puVar13 == local_8c0) break;
                  puVar5 = (uint *)((long)puVar5 - ((long)puVar21 - (long)puVar13));
                  puVar21 = puVar13;
                }
              }
              while (puVar5 = puVar5 + -1, (int)uVar3 < 0) {
                uVar3 = puVar5[-1];
              }
            } while (puVar21 != puVar5);
          }
          uVar31 = local_888;
          if ((int)local_870 == (int)local_888) {
            uVar3 = *local_878;
            puVar21 = local_890;
            if (local_890 < puVar41) {
              lVar30 = (long)piVar9[(int)uVar3];
              pbVar33 = T + lVar30 + 2;
              do {
                lVar12 = (long)(int)*puVar21;
                if (-1 < lVar12) {
                  lVar34 = (long)piVar9[lVar12];
                  pbVar50 = T + lVar34 + 2;
                  pbVar49 = T + (long)piVar9[lVar12 + 1] + 2;
                  bVar54 = pbVar50 < pbVar49;
                  pbVar17 = pbVar33;
                  bVar53 = pbVar33 < pbVar48;
                  if ((pbVar33 < pbVar48) && (puVar35 = T, pbVar50 < pbVar49)) {
                    do {
                      bVar19 = puVar35[lVar30 + 2];
                      bVar45 = puVar35[lVar34 + 2];
                      if (bVar19 != bVar45) goto LAB_0019f37b;
                      pbVar50 = puVar35 + lVar34 + 3;
                      bVar54 = pbVar50 < pbVar49;
                      puVar38 = puVar35 + 1;
                      bVar53 = puVar35 + lVar30 + 3 < pbVar48;
                    } while ((bVar53) && (puVar35 = puVar38, pbVar50 < pbVar49));
                    pbVar17 = puVar38 + lVar30 + 2;
                    pbVar50 = puVar38 + lVar34 + 2;
                  }
                  if (!bVar53) break;
                  if (bVar54) {
                    bVar19 = *pbVar17;
                    bVar45 = *pbVar50;
LAB_0019f37b:
                    if (bVar19 <= bVar45) break;
                  }
                }
                puVar21[-1] = *puVar21;
                puVar21 = puVar21 + 1;
              } while (puVar21 < puVar41);
            }
            puVar21[-1] = uVar3;
          }
        }
        uVar3 = (int)local_858 - 1;
        local_92c = uVar4;
      } while ((int)local_860 < (int)uVar3);
      iVar15 = (int)local_860 + -1;
    } while (0 < (int)uVar4);
    uVar31 = uVar31 & 0xffffffff;
    do {
      uVar4 = (uint)uVar31;
      uVar3 = local_8a0[uVar31];
      if (-1 < (int)uVar3) {
        uVar29 = 0;
        do {
          uVar16 = uVar31;
          puVar1[uVar3] = uVar4 + uVar29;
          uVar31 = uVar16 - 1;
          if (uVar16 == 0) {
            *local_8a0 = ~uVar4;
            goto LAB_0019f57b;
          }
          uVar3 = local_8a0[uVar31];
          uVar29 = uVar29 - 1;
        } while (-1 < (int)uVar3);
        local_8a0[uVar16] = uVar29;
        if (uVar31 == 0) break;
        uVar4 = uVar4 + uVar29;
      }
      uVar16 = (ulong)local_8a0[(int)uVar4];
      lVar30 = (long)(int)uVar4 + 1;
      uVar31 = (ulong)(uVar4 - 1);
      do {
        local_8a0[lVar30 + -1] = ~(uint)uVar16;
        puVar1[(int)~(uint)uVar16] = uVar4;
        uVar16 = (ulong)(int)local_8a0[lVar30 + -2];
        lVar30 = lVar30 + -1;
        uVar31 = (ulong)((int)uVar31 - 1);
      } while ((long)uVar16 < 0);
      puVar1[uVar16] = uVar4;
    } while (1 < lVar30);
LAB_0019f57b:
    if (uVar7 < 0x10000) {
      if (uVar7 < 0x100) {
        iVar15 = lg_table[(long)local_850];
      }
      else {
        iVar15 = lg_table[uVar7 >> 8] + 8;
      }
    }
    else if (uVar7 < 0x1000000) {
      iVar15 = lg_table[uVar7 >> 0x10] + 0x10;
    }
    else {
      iVar15 = lg_table[uVar7 >> 0x18] + 0x18;
    }
    uVar4 = -uVar7;
    uVar3 = *local_8a0;
    puVar41 = local_8a0;
    if (uVar3 != uVar4 && SBORROW4(uVar3,uVar4) == (int)(uVar3 + uVar7) < 0) {
      puVar21 = puVar1 + 1;
      iVar15 = (iVar15 * 2) / 3;
      puVar5 = local_8a0 + 1;
      local_8d0 = (uint *)-(long)local_8a0;
      local_918 = puVar10;
      local_870 = puVar5;
      do {
        local_878 = (uint *)((long)puVar21 - (long)puVar1);
        lVar30 = (long)(int)((ulong)local_878 >> 2);
        local_858 = -lVar30;
        uVar29 = 0;
        local_890 = (uint *)((ulong)local_890 & 0xffffffff00000000);
        local_860 = puVar41;
        local_868 = puVar21;
LAB_0019f687:
        if (-1 < (int)uVar3) {
          if (uVar29 != 0) {
            local_860[(int)uVar29] = uVar29;
          }
          local_8a8 = puVar5 + (int)puVar1[uVar3];
          uVar16 = (long)local_8a8 - (long)local_860;
          if ((long)uVar16 < 5) {
            uVar29 = -(uint)(uVar16 == 4);
            goto LAB_001a118a;
          }
          uVar3 = (uint)(uVar16 >> 2);
          if (uVar3 < 0x10000) {
            if (uVar3 < 0x100) {
              uVar3 = lg_table[uVar16 >> 2 & 0xff];
            }
            else {
              uVar3 = lg_table[(uint)(uVar16 >> 10) & 0xffffff] + 8;
            }
          }
          else if (uVar3 < 0x1000000) {
            uVar3 = lg_table[uVar16 >> 0x12 & 0xffff] + 0x10;
          }
          else {
            uVar3 = lg_table[uVar16 >> 0x1a & 0xff] + 0x18;
          }
          local_8c8 = (uint *)lg_table;
          uVar29 = 0xffffffff;
          local_92c = 0;
          uVar16 = 0;
          local_8d8 = local_918;
          puVar13 = local_8a8;
          puVar5 = local_860;
LAB_0019f77c:
          uVar20 = (uint)uVar16;
          puVar6 = local_8c8;
          if ((int)uVar3 < 0) {
            if (uVar3 != 0xfffffffe) {
              if (uVar3 != 0xffffffff) goto LAB_0019f990;
              puVar6 = puVar21 + local_858;
              tr_partition((int *)puVar6,(int *)puVar5,(int *)puVar5,(int *)puVar13,
                           (int **)&local_8d8,(int **)&local_8c8,
                           (int)((ulong)((long)puVar13 - (long)puVar41) >> 2) + -1);
              if ((local_8d8 < puVar13) && (puVar5 < local_8d8)) {
                puVar14 = puVar5;
                do {
                  puVar1[(int)*puVar14] = (int)((ulong)((long)local_8d8 - (long)puVar41) >> 2) - 1;
                  puVar14 = puVar14 + 1;
                } while (puVar14 < local_8d8);
              }
              if ((local_8c8 < puVar13) && (local_8d8 < local_8c8)) {
                puVar14 = local_8d8;
                do {
                  puVar1[(int)*puVar14] = (int)((ulong)((long)local_8c8 - (long)puVar41) >> 2) - 1;
                  puVar14 = puVar14 + 1;
                } while (puVar14 < local_8c8);
              }
              if (4 < (long)local_8c8 - (long)local_8d8) {
                if (0x3f < (int)uVar20) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb970,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                lVar12 = (long)(int)uVar20;
                (local_838 + lVar12 * 8)[0] = 0;
                (local_838 + lVar12 * 8)[1] = 0;
                *(uint **)(local_838 + lVar12 * 8 + 2) = local_8d8;
                *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8c8;
                (auStack_820 + lVar12 * 8)[0] = 0;
                (auStack_820 + lVar12 * 8)[1] = 0;
                if (uVar20 == 0x3f) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb971,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                auStack_818[lVar12 * 4] = puVar6;
                auStack_818[lVar12 * 4 + 1] = puVar5;
                *(uint **)(auStack_800 + lVar12 * 8 + -2) = puVar13;
                auStack_800[lVar12 * 8] = 0xfffffffe;
                uVar16 = (ulong)(uVar20 + 2);
                auStack_800[lVar12 * 8 + 1] = uVar29;
                uVar29 = uVar20;
              }
              uVar27 = (long)local_8d8 - (long)puVar5;
              uVar31 = (long)uVar27 >> 2;
              uVar25 = (long)puVar13 - (long)local_8c8;
              uVar32 = (long)uVar25 >> 2;
              iVar22 = (int)uVar16;
              if ((long)uVar32 < (long)uVar31) {
                if ((long)uVar32 < 2) {
                  if ((long)uVar31 < 2) {
                    if (iVar22 < 0) {
                      __assert_fail("0 <= ssize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xb984,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
LAB_001a0934:
                    if (iVar22 == 0) goto LAB_001a1145;
                    uVar16 = (ulong)(iVar22 - 1);
                    puVar21 = *(uint **)(local_838 + uVar16 * 8);
                    puVar5 = *(uint **)(local_838 + uVar16 * 8 + 2);
                    uVar3 = auStack_820[uVar16 * 8];
                    uVar29 = auStack_820[uVar16 * 8 + 1];
                    puVar13 = *(uint **)(auStack_820 + uVar16 * 8 + -2);
                  }
                  else {
                    uVar3 = (uint)uVar31;
                    if (0xffff < uVar3) {
                      if (0xffffff < uVar3) {
                        iVar22 = lg_table[uVar3 >> 0x18];
                        goto LAB_001a106b;
                      }
                      iVar22 = *(int *)((long)lg_table + (ulong)(uVar3 >> 0xe & 0x3fc));
                      goto LAB_001a0de7;
                    }
                    if (0xff < uVar3) {
                      iVar22 = lg_table[uVar31 >> 8 & 0xff];
                      goto LAB_001a1057;
                    }
LAB_001a0dbe:
                    uVar3 = lg_table[uVar31 & 0xff];
                    puVar13 = local_8d8;
                  }
                  goto LAB_0019f77c;
                }
                if (0x3f < iVar22) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb97f,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                lVar12 = (long)iVar22;
                *(uint **)(local_838 + lVar12 * 8) = puVar21;
                *(uint **)(local_838 + lVar12 * 8 + 2) = puVar5;
                *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8d8;
                uVar3 = (uint)(uVar27 >> 2);
                if (uVar3 < 0x10000) {
                  if (uVar3 < 0x100) {
                    uVar3 = lg_table[uVar27 >> 2 & 0xff];
                  }
                  else {
                    uVar3 = lg_table[(uint)(uVar27 >> 10) & 0xffffff] + 8;
                  }
                }
                else if (uVar3 < 0x1000000) {
                  uVar3 = lg_table[uVar27 >> 0x12 & 0xffff] + 0x10;
                }
                else {
                  uVar3 = lg_table[uVar27 >> 0x1a & 0xff] + 0x18;
                }
                auStack_820[lVar12 * 8] = uVar3;
                uVar16 = (ulong)(iVar22 + 1);
                auStack_820[lVar12 * 8 + 1] = uVar29;
                uVar32 = uVar25 >> 2;
                uVar3 = (uint)uVar32;
                if (0xffff < uVar3) {
                  if (uVar3 < 0x1000000) {
                    iVar22 = lg_table[uVar25 >> 0x12 & 0xffff];
LAB_001a0d73:
                    uVar3 = iVar22 + 0x10;
                    puVar5 = local_8c8;
                  }
                  else {
                    uVar31 = uVar25 >> 0x1a & 0xff;
LAB_001a1077:
                    uVar3 = lg_table[uVar31] + 0x18;
                    puVar5 = local_8c8;
                  }
                  goto LAB_0019f77c;
                }
                if (uVar3 < 0x100) {
LAB_001a0d3e:
                  uVar3 = lg_table[uVar32 & 0xff];
                  puVar5 = local_8c8;
                  goto LAB_0019f77c;
                }
                iVar22 = lg_table[(uint)(uVar25 >> 10) & 0xffffff];
              }
              else {
                if (1 < (long)uVar31) {
                  if (0x3f < iVar22) {
                    __assert_fail("ssize < STACK_SIZE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xb976,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  lVar12 = (long)iVar22;
                  *(uint **)(local_838 + lVar12 * 8) = puVar21;
                  *(uint **)(local_838 + lVar12 * 8 + 2) = local_8c8;
                  *(uint **)(auStack_820 + lVar12 * 8 + -2) = puVar13;
                  uVar3 = (uint)(uVar25 >> 2);
                  if (uVar3 < 0x10000) {
                    if (uVar3 < 0x100) {
                      uVar3 = lg_table[uVar25 >> 2 & 0xff];
                    }
                    else {
                      uVar3 = lg_table[(uint)(uVar25 >> 10) & 0xffffff] + 8;
                    }
                  }
                  else if (uVar3 < 0x1000000) {
                    uVar3 = lg_table[uVar25 >> 0x12 & 0xffff] + 0x10;
                  }
                  else {
                    uVar3 = lg_table[uVar25 >> 0x1a & 0xff] + 0x18;
                  }
                  auStack_820[lVar12 * 8] = uVar3;
                  uVar16 = (ulong)(iVar22 + 1);
                  auStack_820[lVar12 * 8 + 1] = uVar29;
                  uVar31 = uVar27 >> 2;
                  uVar3 = (uint)uVar31;
                  if (uVar3 < 0x10000) {
                    if (uVar3 < 0x100) goto LAB_001a0dbe;
                    iVar22 = lg_table[(uint)(uVar27 >> 10) & 0xffffff];
LAB_001a1057:
                    uVar3 = iVar22 + 8;
                    puVar13 = local_8d8;
                  }
                  else if (uVar3 < 0x1000000) {
                    iVar22 = lg_table[uVar27 >> 0x12 & 0xffff];
LAB_001a0de7:
                    uVar3 = iVar22 + 0x10;
                    puVar13 = local_8d8;
                  }
                  else {
                    iVar22 = lg_table[uVar27 >> 0x1a & 0xff];
LAB_001a106b:
                    uVar3 = iVar22 + 0x18;
                    puVar13 = local_8d8;
                  }
                  goto LAB_0019f77c;
                }
                if ((long)uVar32 < 2) {
                  if (iVar22 < 0) {
                    __assert_fail("0 <= ssize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xb97b,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  goto LAB_001a0934;
                }
                uVar3 = (uint)uVar32;
                if (0xffff < uVar3) {
                  if (0xffffff < uVar3) {
                    uVar31 = (ulong)(uVar3 >> 0x18);
                    goto LAB_001a1077;
                  }
                  iVar22 = *(int *)((long)lg_table + (ulong)(uVar3 >> 0xe & 0x3fc));
                  goto LAB_001a0d73;
                }
                if (uVar3 < 0x100) goto LAB_001a0d3e;
                iVar22 = lg_table[uVar32 >> 8 & 0xff];
              }
              uVar3 = iVar22 + 8;
              puVar5 = local_8c8;
              goto LAB_0019f77c;
            }
            lVar12 = (long)(int)uVar20;
            local_8d8 = (&local_850)[lVar12 * 4];
            local_8c8 = (uint *)local_848[lVar12 * 4];
            if (local_838[(lVar12 * 4 + -1) * 2] == 0) {
              uVar3 = (int)((ulong)((long)local_8c8 - (long)puVar41) >> 2) - 1;
              puVar6 = local_8d8 + -1;
              iVar22 = (int)((ulong)((long)puVar21 - (long)puVar1) >> 2);
              if (puVar5 <= puVar6) {
                do {
                  uVar29 = *puVar5 - iVar22;
                  if ((-1 < (int)uVar29) && (puVar1[uVar29] == uVar3)) {
                    puVar6[1] = uVar29;
                    puVar6 = puVar6 + 1;
                    puVar1[uVar29] = (uint)((ulong)((long)puVar6 - (long)puVar41) >> 2);
                  }
                  puVar5 = puVar5 + 1;
                } while (puVar5 <= puVar6);
              }
              puVar21 = local_8c8;
              while (puVar6 + 1 < puVar21) {
                puVar13 = puVar13 + -1;
                uVar29 = *puVar13 - iVar22;
                if ((-1 < (int)uVar29) && (puVar1[uVar29] == uVar3)) {
                  puVar21[-1] = uVar29;
                  puVar21 = puVar21 + -1;
                  puVar1[uVar29] = (uint)((ulong)((long)puVar21 - (long)puVar41) >> 2);
                }
              }
            }
            else {
              if (-1 < (int)uVar29) {
                auStack_820[(ulong)uVar29 * 8] = 0xffffffff;
              }
              uVar3 = (int)((ulong)((long)local_8c8 - (long)puVar41) >> 2) - 1;
              puVar6 = local_8d8 + -1;
              uVar29 = 0xffffffff;
              iVar22 = (int)((ulong)((long)puVar21 - (long)puVar1) >> 2);
              if (puVar5 <= puVar6) {
                uVar29 = 0xffffffff;
                uVar36 = 0xffffffff;
                puVar21 = puVar5;
                do {
                  uVar23 = *puVar21;
                  uVar43 = uVar23 - iVar22;
                  if ((-1 < (int)uVar43) && (puVar1[uVar43] == uVar3)) {
                    puVar6[1] = uVar43;
                    puVar6 = puVar6 + 1;
                    uVar23 = puVar1[(int)uVar23];
                    uVar44 = (uint)((ulong)((long)puVar6 - (long)puVar41) >> 2);
                    if (uVar36 == uVar23) {
                      uVar44 = uVar29;
                    }
                    uVar29 = uVar44;
                    puVar1[uVar43] = uVar29;
                    uVar36 = uVar23;
                  }
                  puVar21 = puVar21 + 1;
                } while (puVar21 <= puVar6);
              }
              if (puVar5 <= puVar6) {
                uVar16 = (long)local_8d0 + (long)puVar6;
                puVar21 = puVar6;
                uVar36 = 0xffffffff;
                do {
                  uVar23 = puVar1[(int)*puVar21];
                  uVar43 = (uint)(uVar16 >> 2);
                  if (uVar36 == uVar23) {
                    uVar43 = uVar29;
                  }
                  uVar29 = uVar43;
                  if (uVar29 != uVar23) {
                    puVar1[(int)*puVar21] = uVar29;
                  }
                  puVar21 = puVar21 + -1;
                  uVar16 = uVar16 - 4;
                  uVar36 = uVar23;
                } while (puVar5 <= puVar21);
              }
              if (puVar6 + 1 < local_8c8) {
                uVar36 = 0xffffffff;
                puVar21 = local_8c8;
                do {
                  puVar13 = puVar13 + -1;
                  uVar23 = *puVar13;
                  uVar43 = uVar23 - iVar22;
                  if ((-1 < (int)uVar43) && (puVar1[uVar43] == uVar3)) {
                    puVar21[-1] = uVar43;
                    puVar21 = puVar21 + -1;
                    uVar23 = puVar1[(int)uVar23];
                    uVar44 = (uint)((ulong)((long)puVar21 - (long)puVar41) >> 2);
                    if (uVar36 == uVar23) {
                      uVar44 = uVar29;
                    }
                    uVar29 = uVar44;
                    puVar1[uVar43] = uVar29;
                    uVar36 = uVar23;
                  }
                } while (puVar6 + 1 < puVar21);
              }
            }
            if ((int)uVar20 < 1) {
              __assert_fail("0 <= ssize",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb990,
                            "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                           );
            }
            if (uVar20 == 1) goto LAB_001a1145;
            uVar20 = uVar20 - 2;
LAB_001a05cc:
            uVar16 = (ulong)uVar20;
            puVar21 = *(uint **)(local_838 + uVar16 * 8);
            uVar29 = auStack_820[uVar16 * 8 + 1];
            puVar13 = *(uint **)(auStack_820 + uVar16 * 8 + -2);
            puVar5 = *(uint **)(local_838 + uVar16 * 8 + 2);
            uVar3 = auStack_820[uVar16 * 8];
            goto LAB_0019f77c;
          }
          uVar32 = (long)puVar13 - (long)puVar5;
          uVar31 = (long)uVar32 >> 2;
          puVar14 = puVar5;
          if (8 < (long)uVar31) {
            puVar14 = puVar13 + -1;
            local_8b8 = uVar31;
            if (uVar3 == 0) {
              uVar36 = (uint)uVar31;
              uVar3 = uVar36;
              if ((uVar31 & 1) == 0) {
                uVar3 = uVar36 - 1;
                iVar22 = (int)((uVar36 - ((int)uVar3 >> 0x1f)) + -1) >> 1;
                uVar36 = puVar5[(int)uVar3];
                if ((int)puVar21[(int)puVar5[iVar22]] < (int)puVar21[(int)uVar36]) {
                  puVar5[(int)uVar3] = puVar5[iVar22];
                  puVar5[iVar22] = uVar36;
                }
              }
              if (1 < (int)uVar3) {
                uVar32 = (ulong)(uVar3 >> 1);
                do {
                  uVar25 = uVar32 - 1;
                  uVar36 = puVar5[uVar32 - 1];
                  uVar27 = uVar32 * 2 - 1;
                  if (uVar27 < uVar3) {
                    uVar43 = puVar21[(int)uVar36];
                    uVar51 = uVar32 * 2 - 2;
                    uVar18 = uVar25 & 0xffffffff;
                    do {
                      uVar47 = (uint)uVar27;
                      uVar44 = puVar21[(int)puVar5[(int)uVar47]];
                      uVar8 = puVar21[(int)puVar5[(long)(int)uVar51 + 2]];
                      uVar46 = uVar8;
                      if ((int)uVar8 < (int)uVar44) {
                        uVar46 = uVar44;
                      }
                      uVar23 = (uint)uVar18;
                      if ((int)uVar46 <= (int)uVar43) break;
                      if ((int)uVar44 < (int)uVar8) {
                        uVar47 = (int)uVar51 + 2;
                      }
                      uVar18 = (ulong)uVar47;
                      puVar5[(int)uVar23] = puVar5[(int)uVar47];
                      uVar44 = uVar47 * 2 + 1;
                      uVar27 = (ulong)uVar44;
                      uVar51 = (ulong)(uVar47 * 2);
                      uVar23 = uVar47;
                    } while ((int)uVar44 < (int)uVar3);
                  }
                  else {
                    uVar23 = (uint)uVar25;
                  }
                  puVar5[(int)uVar23] = uVar36;
                  bVar53 = 1 < (long)uVar32;
                  uVar32 = uVar25;
                } while (bVar53);
              }
              if ((uVar31 & 1) == 0) {
                uVar36 = *puVar5;
                *puVar5 = puVar5[(int)uVar3];
                puVar5[(int)uVar3] = uVar36;
                uVar36 = *puVar5;
                if ((int)uVar3 < 2) {
                  lVar12 = 0;
                }
                else {
                  uVar23 = puVar21[(int)uVar36];
                  iVar22 = 0;
                  iVar39 = 1;
                  iVar52 = 0;
                  do {
                    uVar43 = puVar21[(int)puVar5[iVar39]];
                    uVar44 = puVar21[(int)puVar5[(long)iVar22 + 2]];
                    uVar8 = uVar44;
                    if ((int)uVar44 < (int)uVar43) {
                      uVar8 = uVar43;
                    }
                    if ((int)uVar8 <= (int)uVar23) {
                      lVar12 = (long)iVar52;
                      break;
                    }
                    iVar37 = iVar39;
                    if ((int)uVar43 < (int)uVar44) {
                      iVar37 = iVar22 + 2;
                    }
                    lVar12 = (long)iVar37;
                    puVar5[iVar52] = puVar5[lVar12];
                    iVar22 = iVar37 * 2;
                    iVar39 = iVar37 * 2 + 1;
                    iVar52 = iVar37;
                  } while (iVar39 < (int)uVar3);
                }
                puVar5[lVar12] = uVar36;
              }
              if (1 < (int)uVar3) {
                uVar36 = *puVar5;
                puVar41 = puVar5 + ((ulong)uVar3 - 1);
                uVar23 = *puVar41;
                *puVar5 = uVar23;
                uVar31 = (ulong)uVar3;
                while (uVar32 = uVar31 - 1, 1 < uVar32) {
                  uVar3 = puVar21[(int)uVar23];
                  iVar22 = 0;
                  iVar39 = 1;
                  iVar52 = 0;
                  do {
                    uVar43 = puVar21[(int)puVar5[iVar39]];
                    uVar44 = puVar21[(int)puVar5[(long)iVar22 + 2]];
                    uVar8 = uVar44;
                    if ((int)uVar44 < (int)uVar43) {
                      uVar8 = uVar43;
                    }
                    if ((int)uVar8 <= (int)uVar3) {
                      lVar12 = (long)iVar52;
                      break;
                    }
                    iVar37 = iVar39;
                    if ((int)uVar43 < (int)uVar44) {
                      iVar37 = iVar22 + 2;
                    }
                    lVar12 = (long)iVar37;
                    puVar5[iVar52] = puVar5[lVar12];
                    iVar22 = iVar37 * 2;
                    iVar39 = iVar37 * 2 + 1;
                    iVar52 = iVar37;
                  } while ((long)iVar39 < (long)uVar32);
                  puVar5[lVar12] = uVar23;
                  *puVar41 = uVar36;
                  uVar36 = *puVar5;
                  puVar41 = puVar5 + (uVar31 - 2);
                  uVar23 = *puVar41;
                  *puVar5 = uVar23;
                  uVar31 = uVar32;
                }
                *puVar41 = uVar36;
              }
joined_r0x001a0aa7:
              local_8d8 = puVar14;
              puVar41 = local_8a0;
              local_8c0 = local_8c8;
              if (puVar5 < local_8d8) {
                puVar6 = local_8d8 + -1;
                puVar14 = puVar6;
                if (puVar5 <= puVar6) {
                  uVar3 = puVar21[(int)*local_8d8];
                  do {
                    puVar14 = puVar6;
                    if (puVar21[(int)*puVar6] != uVar3) break;
                    *puVar6 = ~*puVar6;
                    puVar6 = puVar6 + -1;
                    puVar14 = puVar6;
                  } while (puVar5 <= puVar6);
                }
                goto joined_r0x001a0aa7;
              }
              goto LAB_0019f990;
            }
            uVar36 = (uint)(uVar32 >> 2);
            puVar6 = puVar5 + ((int)(((uint)(uVar32 >> 0x21) & 1) + uVar36) >> 1);
            if ((int)uVar36 < 0x201) {
              if ((int)uVar36 < 0x21) {
                uVar23 = *puVar5;
                uVar36 = *puVar6;
                local_8d8 = puVar6;
                uVar43 = uVar36;
                if ((int)puVar21[(int)uVar36] < (int)puVar21[(int)uVar23]) {
                  local_8d8 = puVar5;
                  uVar43 = uVar23;
                }
                if ((int)puVar21[(int)*puVar14] < (int)puVar21[(int)uVar43]) {
                  if ((int)puVar21[(int)uVar23] <= (int)puVar21[(int)uVar36]) {
                    puVar6 = puVar5;
                    uVar36 = uVar23;
                  }
                  local_8d8 = puVar14;
                  if ((int)puVar21[(int)*puVar14] < (int)puVar21[(int)uVar36]) {
                    local_8d8 = puVar6;
                  }
                }
              }
              else {
                uVar31 = (ulong)(uint)((int)(uVar32 >> 4) << 2);
                puVar28 = (uint *)((long)puVar14 - uVar31);
                uVar36 = *(uint *)((long)puVar5 + uVar31);
                puVar26 = (uint *)((long)puVar5 + uVar31);
                puVar42 = puVar6;
                if ((int)puVar21[(int)*puVar6] < (int)puVar21[(int)uVar36]) {
                  puVar42 = puVar26;
                  uVar36 = *puVar6;
                  puVar26 = puVar6;
                }
                uVar23 = *puVar28;
                puVar6 = puVar14;
                if ((int)puVar21[(int)*puVar14] < (int)puVar21[(int)uVar23]) {
                  puVar6 = puVar28;
                  uVar23 = *puVar14;
                  puVar28 = puVar14;
                }
                puVar14 = puVar6;
                if ((int)puVar21[(int)uVar23] < (int)puVar21[(int)uVar36]) {
                  puVar14 = puVar42;
                  puVar42 = puVar6;
                  puVar28 = puVar26;
                }
                uVar23 = *puVar5;
                puVar6 = puVar42;
                uVar36 = uVar23;
                local_8d8 = puVar5;
                if ((int)puVar21[(int)*puVar42] < (int)puVar21[(int)uVar23]) {
                  puVar6 = puVar5;
                  uVar36 = *puVar42;
                  local_8d8 = puVar42;
                }
                if ((int)puVar21[(int)uVar36] <= (int)puVar21[(int)*puVar28]) {
                  local_8d8 = puVar28;
                  puVar14 = puVar6;
                }
                if ((int)puVar21[(int)*puVar14] <= (int)puVar21[(int)*local_8d8]) {
                  local_8d8 = puVar14;
                }
              }
            }
            else {
              local_8c0 = (uint *)CONCAT44(local_8c0._4_4_,uVar3);
              uVar31 = uVar32 >> 5 & 0x1fffffff;
              puVar41 = puVar5 + uVar31;
              uVar23 = *puVar5;
              local_898 = (byte *)(long)(int)uVar23;
              uVar43 = *puVar41;
              puVar26 = puVar41;
              uVar44 = uVar43;
              if ((int)puVar21[(int)uVar43] < (int)puVar21[(long)local_898]) {
                puVar26 = puVar5;
                uVar44 = uVar23;
              }
              if ((int)puVar21[*(int *)((long)puVar5 + (ulong)(uVar36 & 0xfffffff8))] <
                  (int)puVar21[(int)uVar44]) {
                if ((int)puVar21[(long)local_898] <= (int)puVar21[(int)uVar43]) {
                  puVar41 = puVar5;
                  uVar43 = uVar23;
                }
                puVar26 = puVar41;
                if ((int)puVar21[(int)uVar43] <=
                    (int)puVar21[*(int *)((long)puVar5 + (ulong)(uVar36 & 0xfffffff8))]) {
                  puVar26 = (uint *)((ulong)(uVar36 & 0xfffffff8) + (long)puVar5);
                }
              }
              uVar32 = (ulong)(uint)((int)uVar31 * 4);
              puVar41 = (uint *)((long)puVar6 - uVar32);
              uVar36 = *puVar41;
              uVar43 = *puVar6;
              puVar28 = puVar6;
              uVar44 = uVar43;
              if ((int)puVar21[(int)uVar43] < (int)puVar21[(int)uVar36]) {
                puVar28 = puVar41;
                uVar44 = uVar36;
              }
              if ((int)puVar21[*(int *)((long)puVar6 + uVar32)] < (int)puVar21[(int)uVar44]) {
                if ((int)puVar21[(int)uVar43] < (int)puVar21[(int)uVar36]) {
                  puVar41 = puVar6;
                  uVar36 = uVar43;
                }
                puVar28 = puVar41;
                if ((int)puVar21[(int)uVar36] <= (int)puVar21[*(int *)((long)puVar6 + uVar32)]) {
                  puVar28 = (uint *)(uVar32 + (long)puVar6);
                }
              }
              puVar42 = (uint *)((long)puVar14 - (ulong)(uint)((int)uVar31 << 3));
              puVar41 = puVar14 + -uVar31;
              uVar36 = *puVar42;
              uVar43 = *puVar41;
              puVar6 = puVar41;
              uVar44 = uVar43;
              if ((int)puVar21[(int)uVar43] < (int)puVar21[(int)uVar36]) {
                puVar6 = puVar42;
                uVar44 = uVar36;
              }
              uVar44 = puVar21[(int)uVar44];
              if ((int)puVar21[(int)*puVar14] < (int)uVar44) {
                if ((int)puVar21[(int)uVar43] < (int)puVar21[(int)uVar36]) {
                  puVar42 = puVar41;
                  uVar36 = uVar43;
                }
                puVar6 = puVar14;
                if ((int)puVar21[(int)*puVar14] < (int)puVar21[(int)uVar36]) {
                  puVar6 = puVar42;
                }
                uVar44 = puVar21[(int)*puVar6];
              }
              uVar36 = *puVar26;
              uVar43 = *puVar28;
              local_8d8 = puVar28;
              uVar8 = uVar43;
              if ((int)puVar21[(int)uVar43] < (int)puVar21[(int)uVar36]) {
                local_8d8 = puVar26;
                uVar8 = uVar36;
              }
              puVar41 = local_8a0;
              if ((int)uVar44 < (int)puVar21[(int)uVar8]) {
                if ((int)puVar21[(int)uVar43] < (int)puVar21[(int)uVar36]) {
                  puVar26 = puVar28;
                  uVar36 = uVar43;
                }
                local_8d8 = puVar6;
                if ((int)uVar44 < (int)puVar21[(int)uVar36]) {
                  local_8d8 = puVar26;
                }
              }
            }
            *puVar5 = *local_8d8;
            *local_8d8 = uVar23;
            uVar36 = puVar21[(int)*puVar5];
            tr_partition((int *)puVar21,(int *)puVar5,(int *)(puVar5 + 1),(int *)puVar13,
                         (int **)&local_8d8,(int **)&local_8c8,uVar36);
            uVar31 = (long)local_8c8 - (long)local_8d8 >> 2;
            if (local_8b8 == uVar31) {
              uVar36 = (uint)local_8b8;
              if ((int)local_918 < (int)uVar36) {
                if (iVar15 != 0) {
                  local_918._0_4_ = (int)local_918 + uVar7;
                  iVar15 = iVar15 + -1;
                  goto LAB_001a0442;
                }
                if (-1 < (int)uVar29) {
                  auStack_820[(ulong)uVar29 * 8] = 0xffffffff;
                }
                if ((int)uVar20 < 0) {
                  __assert_fail("0 <= ssize",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xba28,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                local_92c = local_92c + uVar36;
                if (uVar20 == 0) {
                  iVar15 = 0;
                  goto LAB_001a1145;
                }
LAB_001a08e1:
                uVar16 = (ulong)(uVar20 - 1);
                puVar21 = *(uint **)(local_838 + uVar16 * 8);
                uVar29 = auStack_820[uVar16 * 8 + 1];
                iVar15 = 0;
                puVar13 = *(uint **)(auStack_820 + uVar16 * 8 + -2);
                puVar5 = *(uint **)(local_838 + uVar16 * 8 + 2);
                uVar3 = auStack_820[uVar16 * 8];
              }
              else {
LAB_001a0442:
                if (uVar36 < 0x10000) {
                  if (uVar36 < 0x100) {
                    uVar3 = lg_table[local_8b8 & 0xff];
                  }
                  else {
                    uVar3 = lg_table[local_8b8 >> 8 & 0xff] + 8;
                  }
                }
                else if (uVar36 < 0x1000000) {
                  uVar3 = *(int *)((long)lg_table + (ulong)(uVar36 >> 0xe & 0x3fc)) + 0x10;
                }
                else {
                  uVar3 = lg_table[uVar36 >> 0x18] + 0x18;
                }
                local_918 = (uint *)(ulong)((int)local_918 - uVar36);
                puVar21 = puVar21 + lVar30;
              }
              goto LAB_0019f77c;
            }
            uVar23 = 0xffffffff;
            uVar43 = (uint)uVar31;
            if (puVar1[(int)*local_8d8] != uVar36) {
              if (uVar43 < 0x10000) {
                if (uVar43 < 0x100) {
                  uVar23 = lg_table[uVar31 & 0xff];
                }
                else {
                  uVar23 = lg_table[uVar31 >> 8 & 0xff] + 8;
                }
              }
              else if (uVar43 < 0x1000000) {
                uVar23 = *(int *)((long)lg_table + (ulong)(uVar43 >> 0xe & 0x3fc)) + 0x10;
              }
              else {
                uVar23 = lg_table[uVar43 >> 0x18] + 0x18;
              }
            }
            if (puVar5 < local_8d8) {
              puVar6 = puVar5;
              do {
                puVar1[(int)*puVar6] = (int)((ulong)((long)local_8d8 - (long)puVar41) >> 2) - 1;
                puVar6 = puVar6 + 1;
              } while (puVar6 < local_8d8);
            }
            if ((local_8c8 < puVar13) && (local_8d8 < local_8c8)) {
              puVar6 = local_8d8;
              do {
                puVar1[(int)*puVar6] = (int)((ulong)((long)local_8c8 - (long)puVar41) >> 2) - 1;
                puVar6 = puVar6 + 1;
              } while (puVar6 < local_8c8);
            }
            uVar3 = uVar3 - 1;
            if (1 < (long)uVar31) {
              if ((int)local_918 < (int)uVar43) {
                if (iVar15 == 0) {
                  local_92c = local_92c + uVar43;
                  goto LAB_001a049d;
                }
                local_918._0_4_ = (int)local_918 + uVar7;
                iVar15 = iVar15 + -1;
              }
              local_918 = (uint *)(ulong)((int)local_918 - uVar43);
              lVar12 = (long)local_8d8 - (long)puVar5 >> 2;
              lVar34 = (long)puVar13 - (long)local_8c8 >> 2;
              if (lVar34 < lVar12) {
                if ((long)uVar31 < lVar12) {
                  if ((long)uVar31 < lVar34) {
                    if (0x3f < (int)uVar20) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xba08,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    lVar12 = (long)(int)uVar20;
                    *(uint **)(local_838 + lVar12 * 8) = puVar21;
                    *(uint **)(local_838 + lVar12 * 8 + 2) = puVar5;
                    *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8d8;
                    auStack_820[lVar12 * 8] = uVar3;
                    auStack_820[lVar12 * 8 + 1] = uVar29;
                    if (uVar20 == 0x3f) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xba09,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    auStack_818[lVar12 * 4] = puVar21;
                    auStack_818[lVar12 * 4 + 1] = local_8c8;
                    *(uint **)(auStack_800 + lVar12 * 8 + -2) = puVar13;
LAB_001a089b:
                    auStack_800[(long)(int)uVar20 * 8] = uVar3;
                    uVar16 = (ulong)(uVar20 + 2);
                    auStack_800[(long)(int)uVar20 * 8 + 1] = uVar29;
                  }
                  else {
                    if (1 < lVar34) {
                      if (0x3f < (int)uVar20) {
                        __assert_fail("ssize < STACK_SIZE",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xba00,
                                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                     );
                      }
                      lVar12 = (long)(int)uVar20;
                      *(uint **)(local_838 + lVar12 * 8) = puVar21;
                      *(uint **)(local_838 + lVar12 * 8 + 2) = puVar5;
                      *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8d8;
                      auStack_820[lVar12 * 8] = uVar3;
                      auStack_820[lVar12 * 8 + 1] = uVar29;
                      if (uVar20 == 0x3f) {
                        __assert_fail("ssize < STACK_SIZE",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xba01,
                                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                     );
                      }
                      auStack_818[lVar12 * 4] = puVar21 + lVar30;
                      auStack_818[lVar12 * 4 + 1] = local_8d8;
                      *(uint **)(auStack_800 + lVar12 * 8 + -2) = local_8c8;
                      auStack_800[lVar12 * 8] = uVar23;
                      uVar20 = uVar20 + 2;
                      auStack_800[lVar12 * 8 + 1] = uVar29;
LAB_001a103f:
                      uVar16 = (ulong)uVar20;
                      puVar5 = local_8c8;
                      goto LAB_0019f77c;
                    }
                    if (0x3f < (int)uVar20) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xba04,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    lVar12 = (long)(int)uVar20;
                    *(uint **)(local_838 + lVar12 * 8) = puVar21;
                    *(uint **)(local_838 + lVar12 * 8 + 2) = puVar5;
                    *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8d8;
LAB_001a10f4:
                    auStack_820[(long)(int)uVar20 * 8] = uVar3;
                    uVar16 = (ulong)(uVar20 + 1);
                    auStack_820[(long)(int)uVar20 * 8 + 1] = uVar29;
                  }
LAB_001a1107:
                  puVar21 = puVar21 + lVar30;
                  puVar13 = local_8c8;
                  puVar5 = local_8d8;
                  uVar3 = uVar23;
                  goto LAB_0019f77c;
                }
                if (lVar34 < 2) {
                  if (lVar12 < 2) {
                    puVar21 = puVar21 + lVar30;
                    puVar13 = local_8c8;
                    puVar5 = local_8d8;
                    uVar3 = uVar23;
                  }
                  else {
                    if (0x3f < (int)uVar20) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xb9f9,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    lVar12 = (long)(int)uVar20;
                    *(uint **)(local_838 + lVar12 * 8) = puVar21 + lVar30;
                    *(uint **)(local_838 + lVar12 * 8 + 2) = local_8d8;
                    *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8c8;
                    auStack_820[lVar12 * 8] = uVar23;
                    uVar16 = (ulong)(uVar20 + 1);
                    auStack_820[lVar12 * 8 + 1] = uVar29;
                    puVar13 = local_8d8;
                  }
                }
                else {
                  if (0x3f < (int)uVar20) {
                    __assert_fail("ssize < STACK_SIZE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xb9f5,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  lVar12 = (long)(int)uVar20;
                  *(uint **)(local_838 + lVar12 * 8) = puVar21 + lVar30;
                  *(uint **)(local_838 + lVar12 * 8 + 2) = local_8d8;
                  *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8c8;
                  auStack_820[lVar12 * 8] = uVar23;
                  auStack_820[lVar12 * 8 + 1] = uVar29;
                  if (uVar20 == 0x3f) {
                    __assert_fail("ssize < STACK_SIZE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xb9f6,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  auStack_818[lVar12 * 4] = puVar21;
                  auStack_818[lVar12 * 4 + 1] = puVar5;
                  *(uint **)(auStack_800 + lVar12 * 8 + -2) = local_8d8;
                  auStack_800[lVar12 * 8] = uVar3;
                  uVar16 = (ulong)(uVar20 + 2);
                  auStack_800[lVar12 * 8 + 1] = uVar29;
                  puVar5 = local_8c8;
                }
              }
              else if ((long)uVar31 < lVar34) {
                if ((long)uVar31 < lVar12) {
                  if (0x3f < (int)uVar20) {
                    __assert_fail("ssize < STACK_SIZE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xb9ee,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  lVar12 = (long)(int)uVar20;
                  *(uint **)(local_838 + lVar12 * 8) = puVar21;
                  *(uint **)(local_838 + lVar12 * 8 + 2) = local_8c8;
                  *(uint **)(auStack_820 + lVar12 * 8 + -2) = puVar13;
                  auStack_820[lVar12 * 8] = uVar3;
                  auStack_820[lVar12 * 8 + 1] = uVar29;
                  if (uVar20 == 0x3f) {
                    __assert_fail("ssize < STACK_SIZE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xb9ef,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  auStack_818[lVar12 * 4] = puVar21;
                  auStack_818[lVar12 * 4 + 1] = puVar5;
                  *(uint **)(auStack_800 + lVar12 * 8 + -2) = local_8d8;
                  goto LAB_001a089b;
                }
                if (lVar12 < 2) {
                  if (0x3f < (int)uVar20) {
                    __assert_fail("ssize < STACK_SIZE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xb9ea,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  lVar12 = (long)(int)uVar20;
                  *(uint **)(local_838 + lVar12 * 8) = puVar21;
                  *(uint **)(local_838 + lVar12 * 8 + 2) = local_8c8;
                  *(uint **)(auStack_820 + lVar12 * 8 + -2) = puVar13;
                  goto LAB_001a10f4;
                }
                if (0x3f < (int)uVar20) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb9e6,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                lVar12 = (long)(int)uVar20;
                *(uint **)(local_838 + lVar12 * 8) = puVar21;
                *(uint **)(local_838 + lVar12 * 8 + 2) = local_8c8;
                *(uint **)(auStack_820 + lVar12 * 8 + -2) = puVar13;
                auStack_820[lVar12 * 8] = uVar3;
                auStack_820[lVar12 * 8 + 1] = uVar29;
                if (uVar20 == 0x3f) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb9e7,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                auStack_818[lVar12 * 4] = puVar21 + lVar30;
                auStack_818[lVar12 * 4 + 1] = local_8d8;
                *(uint **)(auStack_800 + lVar12 * 8 + -2) = local_8c8;
                auStack_800[lVar12 * 8] = uVar23;
                uVar16 = (ulong)(uVar20 + 2);
                auStack_800[lVar12 * 8 + 1] = uVar29;
                puVar13 = local_8d8;
              }
              else {
                if (lVar12 < 2) {
                  if (1 < lVar34) {
                    if (0x3f < (int)uVar20) {
                      __assert_fail("ssize < STACK_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xb9df,
                                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                   );
                    }
                    lVar12 = (long)(int)uVar20;
                    *(uint **)(local_838 + lVar12 * 8) = puVar21 + lVar30;
                    *(uint **)(local_838 + lVar12 * 8 + 2) = local_8d8;
                    *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8c8;
                    auStack_820[lVar12 * 8] = uVar23;
                    uVar20 = uVar20 + 1;
                    auStack_820[lVar12 * 8 + 1] = uVar29;
                    goto LAB_001a103f;
                  }
                  goto LAB_001a1107;
                }
                if (0x3f < (int)uVar20) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb9db,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                lVar12 = (long)(int)uVar20;
                *(uint **)(local_838 + lVar12 * 8) = puVar21 + lVar30;
                *(uint **)(local_838 + lVar12 * 8 + 2) = local_8d8;
                *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8c8;
                auStack_820[lVar12 * 8] = uVar23;
                auStack_820[lVar12 * 8 + 1] = uVar29;
                if (uVar20 == 0x3f) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb9dc,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                auStack_818[lVar12 * 4] = puVar21;
                auStack_818[lVar12 * 4 + 1] = local_8c8;
                *(uint **)(auStack_800 + lVar12 * 8 + -2) = puVar13;
                auStack_800[lVar12 * 8] = uVar3;
                uVar16 = (ulong)(uVar20 + 2);
                auStack_800[lVar12 * 8 + 1] = uVar29;
                puVar13 = local_8d8;
              }
              goto LAB_0019f77c;
            }
LAB_001a049d:
            if ((4 < (long)local_8c8 - (long)local_8d8) && (-1 < (int)uVar29)) {
              auStack_820[(ulong)uVar29 * 8] = 0xffffffff;
            }
            lVar12 = (long)local_8d8 - (long)puVar5 >> 2;
            lVar34 = (long)puVar13 - (long)local_8c8 >> 2;
            if (lVar12 <= lVar34) {
              if (lVar12 < 2) {
                puVar5 = local_8c8;
                if (lVar34 < 2) {
                  if ((int)uVar20 < 0) {
                    __assert_fail("0 <= ssize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xba16,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  goto LAB_0019fb38;
                }
              }
              else {
                if (0x3f < (int)uVar20) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xba11,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                lVar12 = (long)(int)uVar20;
                *(uint **)(local_838 + lVar12 * 8) = puVar21;
                *(uint **)(local_838 + lVar12 * 8 + 2) = local_8c8;
                *(uint **)(auStack_820 + lVar12 * 8 + -2) = puVar13;
                auStack_820[lVar12 * 8] = uVar3;
                uVar16 = (ulong)(uVar20 + 1);
                auStack_820[lVar12 * 8 + 1] = uVar29;
                puVar13 = local_8d8;
              }
              goto LAB_0019f77c;
            }
            if (1 < lVar34) {
              if (0x3f < (int)uVar20) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xba1a,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              lVar12 = (long)(int)uVar20;
              *(uint **)(local_838 + lVar12 * 8) = puVar21;
              *(uint **)(local_838 + lVar12 * 8 + 2) = puVar5;
              *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8d8;
              auStack_820[lVar12 * 8] = uVar3;
              uVar16 = (ulong)(uVar20 + 1);
              auStack_820[lVar12 * 8 + 1] = uVar29;
              puVar5 = local_8c8;
              goto LAB_0019f77c;
            }
            puVar13 = local_8d8;
            if (1 < lVar12) goto LAB_0019f77c;
            if ((int)uVar20 < 0) {
              __assert_fail("0 <= ssize",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xba1f,
                            "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                           );
            }
LAB_0019fb38:
            if (uVar20 != 0) {
              uVar20 = uVar20 - 1;
              goto LAB_001a05cc;
            }
            goto LAB_001a1145;
          }
          while (puVar26 = puVar14 + 1, puVar26 < puVar13) {
            uVar3 = puVar14[1];
            lVar12 = (long)(int)*puVar14;
            uVar23 = puVar21[lVar12];
            uVar36 = puVar21[(int)uVar3];
            while (puVar28 = puVar14, (int)uVar36 < (int)uVar23) {
              do {
                puVar14 = puVar28 + -1;
                puVar28[1] = (uint)lVar12;
                if (puVar14 < puVar5) goto LAB_0019f806;
                lVar12 = (long)(int)*puVar14;
                puVar28 = puVar14;
              } while (lVar12 < 0);
              uVar23 = puVar21[lVar12];
              uVar36 = puVar21[(int)uVar3];
            }
LAB_0019f806:
            if (uVar36 == uVar23) {
              *puVar14 = ~*puVar14;
            }
            puVar14[1] = uVar3;
            puVar14 = puVar26;
          }
LAB_0019f990:
          local_8c8 = puVar6;
          uVar3 = *puVar5;
          if (-1 < (int)uVar3) {
            uVar31 = (long)local_8d0 + (long)puVar5;
            do {
              puVar5 = puVar5 + 1;
              puVar1[uVar3] = (uint)(uVar31 >> 2);
              local_8d8 = puVar5;
              if (puVar13 <= puVar5) break;
              uVar3 = *puVar5;
              uVar31 = uVar31 + 4;
            } while (-1 < (int)uVar3);
          }
          if (puVar13 <= puVar5) {
            if ((int)uVar20 < 0) {
              __assert_fail("0 <= ssize",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb9b3,
                            "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                           );
            }
            goto LAB_0019fb38;
          }
          uVar32 = (ulong)*puVar5;
          uVar31 = 4;
          do {
            uVar27 = uVar31;
            *(uint *)((long)puVar5 + (uVar27 - 4)) = ~(uint)uVar32;
            uVar32 = (ulong)*(int *)((long)puVar5 + uVar27);
            uVar31 = uVar27 + 4;
          } while ((long)uVar32 < 0);
          uVar3 = 0xffffffff;
          if (puVar1[uVar32] != puVar21[uVar32]) {
            uVar3 = (int)(uVar27 >> 2) + 1;
            if (uVar3 < 0x10000) {
              if (uVar3 < 0x100) {
                uVar3 = lg_table[uVar3];
              }
              else {
                uVar3 = lg_table[uVar3 >> 8] + 8;
              }
            }
            else if (uVar3 < 0x1000000) {
              uVar3 = lg_table[uVar3 >> 0x10] + 0x10;
            }
            else {
              uVar3 = lg_table[uVar3 >> 0x18] + 0x18;
            }
          }
          local_8d8 = (uint *)((long)puVar5 + uVar31);
          if ((local_8d8 < puVar13) && (local_8c8 = puVar5, puVar5 < local_8d8)) {
            do {
              puVar1[(int)*local_8c8] = (int)((long)puVar5 + uVar31 + (long)local_8d0 >> 2) - 1;
              local_8c8 = local_8c8 + 1;
            } while (local_8c8 < local_8d8);
          }
          iVar22 = (int)(uVar31 >> 2);
          if (iVar22 <= (int)local_918) {
LAB_0019fb7e:
            local_918 = (uint *)(ulong)(uint)((int)local_918 - iVar22);
            lVar12 = (long)puVar13 + (-uVar31 - (long)puVar5);
            if (lVar12 < (long)uVar31) {
              if (4 < lVar12) {
                if (0x3f < (int)uVar20) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb9a4,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                lVar12 = (long)(int)uVar20;
                *(uint **)(local_838 + lVar12 * 8) = puVar21 + lVar30;
                *(uint **)(local_838 + lVar12 * 8 + 2) = puVar5;
                *(uint **)(auStack_820 + lVar12 * 8 + -2) = local_8d8;
                auStack_820[lVar12 * 8] = uVar3;
                uVar16 = (ulong)(uVar20 + 1);
                auStack_820[lVar12 * 8 + 1] = uVar29;
                goto LAB_001a0234;
              }
            }
            else {
              if (0x3f < (int)uVar20) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb9a0,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              lVar12 = (long)(int)uVar20;
              *(uint **)(local_838 + lVar12 * 8) = puVar21;
              *(uint **)(local_838 + lVar12 * 8 + 2) = local_8d8;
              *(uint **)(auStack_820 + lVar12 * 8 + -2) = puVar13;
              auStack_820[lVar12 * 8] = 0xfffffffd;
              uVar16 = (ulong)(uVar20 + 1);
              auStack_820[lVar12 * 8 + 1] = uVar29;
            }
            puVar21 = puVar21 + lVar30;
            puVar13 = local_8d8;
            goto LAB_0019f77c;
          }
          if (iVar15 != 0) {
            local_918._0_4_ = (int)local_918 + uVar7;
            iVar15 = iVar15 + -1;
            goto LAB_0019fb7e;
          }
          if (-1 < (int)uVar29) {
            auStack_820[(ulong)uVar29 * 8] = 0xffffffff;
          }
          local_92c = local_92c + iVar22;
          if (4 < (long)((long)puVar13 + (-uVar31 - (long)puVar5))) {
            iVar15 = 0;
LAB_001a0234:
            puVar5 = local_8d8;
            uVar3 = 0xfffffffd;
            goto LAB_0019f77c;
          }
          if ((int)uVar20 < 0) {
            __assert_fail("0 <= ssize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb9af,
                          "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                         );
          }
          if (uVar20 != 0) goto LAB_001a08e1;
          iVar15 = 0;
LAB_001a1145:
          puVar21 = local_868;
          puVar5 = local_870;
          if (local_92c == 0) {
            uVar29 = (uint)((ulong)((long)local_860 - (long)local_8a8) >> 2);
            goto LAB_001a118a;
          }
          local_890 = (uint *)CONCAT44(local_890._4_4_,(int)local_890 + local_92c);
          uVar29 = 0;
          if (puVar1 <= local_8a8) goto LAB_001a11ad;
LAB_001a118f:
          uVar3 = *local_8a8;
          local_860 = local_8a8;
          goto LAB_0019f687;
        }
        local_8a8 = local_860 + -(long)(int)uVar3;
        uVar29 = uVar29 + uVar3;
LAB_001a118a:
        if (local_8a8 < puVar1) goto LAB_001a118f;
        local_868 = puVar21;
        if (uVar29 != 0) {
          local_8a8[(int)uVar29] = uVar29;
        }
LAB_001a11ad:
        if ((int)local_890 == 0) break;
        puVar21 = (uint *)((long)local_868 + (long)local_878);
        uVar3 = *puVar41;
      } while ((int)uVar4 < (int)uVar3);
    }
    if (0 < (int)local_8b0) {
      bVar19 = T[local_848[0]];
      do {
        uVar16 = 0;
        puVar35 = T;
        bVar45 = bVar19;
        do {
          uVar31 = uVar16;
          puVar35 = puVar35 + -1;
          if ((local_848[0] & 0xffffffff) == uVar31) goto LAB_001a12a8;
          bVar19 = puVar35[local_848[0] & 0xffffffff];
          uVar16 = uVar31 + 1;
          bVar53 = bVar45 <= bVar19;
          bVar45 = bVar19;
        } while (bVar53);
        uVar29 = (uint)uVar16;
        uVar4 = (uint)local_848[0];
        uVar3 = uVar4 - uVar29;
        if ((int)(uVar3 + 1) < 2) {
          local_848[0] = (uVar4 - 1) - uVar16;
        }
        else {
          uVar20 = ~(uint)uVar31 + uVar4;
          do {
            uVar36 = uVar20 - 1;
            bVar19 = T[uVar36];
            if (bVar45 < bVar19) {
              local_848[0] = (ulong)(uVar20 - 1);
              goto LAB_001a126c;
            }
            uVar20 = uVar36;
            bVar45 = bVar19;
          } while (0 < (int)uVar36);
          local_848[0] = 0xffffffff;
        }
LAB_001a126c:
        uVar20 = ~uVar4 + uVar29;
        if (1 < (int)((uVar4 - (int)local_848[0]) - uVar29)) {
          uVar20 = uVar3;
        }
        if (uVar4 == uVar29) {
          uVar20 = uVar3;
        }
        iVar15 = (int)puVar10;
        puVar10 = (uint *)(ulong)(iVar15 - 1);
        puVar41[(int)puVar1[(long)iVar15 + -1]] = uVar20;
      } while (-1 < (int)local_848[0]);
    }
LAB_001a12a8:
    bucket_B[0xffff] = (int)local_8b0;
    uVar16 = 0xfe;
    do {
      uVar3 = (uint)uVar16;
      uVar31 = (ulong)(local_880[uVar16 + 1] - 1);
      uVar4 = uVar3 << 8;
      uVar32 = 0xff;
      do {
        iVar15 = (int)uVar31;
        uVar20 = (uint)uVar32;
        uVar36 = uVar20 << 8 | uVar3;
        uVar29 = iVar15 - bucket_B[(int)uVar36];
        uVar31 = (ulong)uVar29;
        bucket_B[(int)uVar36] = iVar15;
        iVar15 = bucket_B[(int)(uVar20 | uVar4)];
        if (iVar15 <= (int)local_888) {
          uVar31 = (ulong)(int)uVar29;
          lVar30 = (long)(int)local_888 + 1;
          local_888 = (ulong)(iVar15 - 1);
          do {
            puVar41[uVar31] = puVar41[lVar30 + -1];
            uVar31 = uVar31 - 1;
            lVar30 = lVar30 + -1;
          } while (iVar15 < lVar30);
        }
        uVar32 = (ulong)(uVar20 - 1);
      } while (uVar16 < uVar32);
      bucket_B[(int)(uVar3 + 1 | uVar4)] = ((int)uVar31 - bucket_B[(int)(uVar4 | uVar3)]) + 1;
      bucket_B[(int)(uVar4 | uVar3)] = (int)uVar31;
      bVar53 = uVar16 != 0;
      uVar16 = uVar16 - 1;
    } while (bVar53);
  }
  return uVar7;
code_r0x0019f194:
  if (uVar20 < uVar29) {
    do {
      puVar14 = puVar14 + -1;
      uVar29 = *puVar14;
      puVar26 = puVar21 + -1;
      do {
        *puVar14 = *puVar26;
        puVar28 = puVar14 + -1;
        puVar14 = puVar14 + -1;
        *puVar26 = *puVar28;
        puVar26 = puVar26 + -1;
      } while (puVar6 <= puVar26);
      *puVar14 = uVar29;
      uVar29 = (int)uVar31 + ~uVar20;
      uVar31 = (ulong)uVar29;
    } while ((int)uVar20 < (int)uVar29);
  }
  else {
    do {
      uVar20 = *puVar6;
      puVar6 = puVar6 + 1;
      puVar26 = puVar21;
      do {
        puVar28 = puVar6;
        puVar28[-1] = *puVar26;
        *puVar26 = *puVar28;
        puVar26 = puVar26 + 1;
        puVar6 = puVar28 + 1;
      } while (puVar26 < puVar14);
      *puVar28 = uVar20;
      uVar20 = (int)uVar16 + ~uVar29;
      uVar16 = (ulong)uVar20;
    } while ((int)uVar29 < (int)uVar20);
  }
  if (((int)uVar16 < 1) || ((int)uVar31 < 1)) goto LAB_0019f252;
  goto LAB_0019f18b;
}

Assistant:

static
int
sort_typeBstar(const unsigned char *T, int *SA,
               int *bucket_A, int *bucket_B,
               int n, int openMP) {
  int *PAb, *ISAb, *buf;
#ifdef LIBBSC_OPENMP
  int *curbuf;
  int l;
#endif
  int i, j, k, t, m, bufsize;
  int c0, c1;
#ifdef LIBBSC_OPENMP
  int d0, d1;
#endif
  (void)openMP;

  /* Initialize bucket arrays. */
  for(i = 0; i < BUCKET_A_SIZE; ++i) { bucket_A[i] = 0; }
  for(i = 0; i < BUCKET_B_SIZE; ++i) { bucket_B[i] = 0; }

  /* Count the number of occurrences of the first one or two characters of each
     type A, B and B* suffix. Moreover, store the beginning position of all
     type B* suffixes into the array SA. */
  for(i = n - 1, m = n, c0 = T[n - 1]; 0 <= i;) {
    /* type A suffix. */
    do { ++BUCKET_A(c1 = c0); } while((0 <= --i) && ((c0 = T[i]) >= c1));
    if(0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(c0, c1);
      SA[--m] = i;
      /* type B suffix. */
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) {
        ++BUCKET_B(c0, c1);
      }
    }
  }
  m = n - m;
/*
note:
  A type B* suffix is lexicographically smaller than a type B suffix that
  begins with the same first two characters.
*/

  /* Calculate the index of start/end point of each bucket. */
  for(c0 = 0, i = 0, j = 0; c0 < ALPHABET_SIZE; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0) = i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for(c1 = c0 + 1; c1 < ALPHABET_SIZE; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if(0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    PAb = SA + n - m; ISAb = SA + m;
    for(i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
#ifdef LIBBSC_OPENMP
    if (openMP)
    {
        buf = SA + m;
        c0 = ALPHABET_SIZE - 2, c1 = ALPHABET_SIZE - 1, j = m;
#pragma omp parallel default(shared) private(bufsize, curbuf, k, l, d0, d1)
        {
          bufsize = (n - (2 * m)) / omp_get_num_threads();
          curbuf = buf + omp_get_thread_num() * bufsize;
          k = 0;
          for(;;) {
            #pragma omp critical(sssort_lock)
            {
              if(0 < (l = j)) {
                d0 = c0, d1 = c1;
                do {
                  k = BUCKET_BSTAR(d0, d1);
                  if(--d1 <= d0) {
                    d1 = ALPHABET_SIZE - 1;
                    if(--d0 < 0) { break; }
                  }
                } while(((l - k) <= 1) && (0 < (l = k)));
                c0 = d0, c1 = d1, j = k;
              }
            }
            if(l == 0) { break; }
            sssort(T, PAb, SA + k, SA + l,
                   curbuf, bufsize, 2, n, *(SA + k) == (m - 1));
          }
        }
    }
    else
    {
        buf = SA + m, bufsize = n - (2 * m);
        for(c0 = ALPHABET_SIZE - 2, j = m; 0 < j; --c0) {
          for(c1 = ALPHABET_SIZE - 1; c0 < c1; j = i, --c1) {
            i = BUCKET_BSTAR(c0, c1);
            if(1 < (j - i)) {
              sssort(T, PAb, SA + i, SA + j,
                     buf, bufsize, 2, n, *(SA + i) == (m - 1));
            }
          }
        }
    }
#else
    buf = SA + m, bufsize = n - (2 * m);
    for(c0 = ALPHABET_SIZE - 2, j = m; 0 < j; --c0) {
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; j = i, --c1) {
        i = BUCKET_BSTAR(c0, c1);
        if(1 < (j - i)) {
          sssort(T, PAb, SA + i, SA + j,
                 buf, bufsize, 2, n, *(SA + i) == (m - 1));
        }
      }
    }
#endif

    /* Compute ranks of type B* substrings. */
    for(i = m - 1; 0 <= i; --i) {
      if(0 <= SA[i]) {
        j = i;
        do { ISAb[SA[i]] = i; } while((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if(i <= 0) { break; }
      }
      j = i;
      do { ISAb[SA[i] = ~SA[i]] = j; } while(SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using trsort. */
    trsort(ISAb, SA, m, 1);

    /* Set the sorted order of type B* suffixes. */
    for(i = n - 1, j = m, c0 = T[n - 1]; 0 <= i;) {
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) >= c1); --i, c1 = c0) { }
      if(0 <= i) {
        t = i;
        for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) { }
        SA[ISAb[--j]] = ((t == 0) || (1 < (t - i))) ? t : ~t;
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    BUCKET_B(ALPHABET_SIZE - 1, ALPHABET_SIZE - 1) = n; /* end point */
    for(c0 = ALPHABET_SIZE - 2, k = m - 1; 0 <= c0; --c0) {
      i = BUCKET_A(c0 + 1) - 1;
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for(i = t, j = BUCKET_BSTAR(c0, c1);
            j <= k;
            --i, --k) { SA[i] = SA[k]; }
      }
      BUCKET_BSTAR(c0, c0 + 1) = i - BUCKET_B(c0, c0) + 1; /* start point */
      BUCKET_B(c0, c0) = i; /* end point */
    }
  }

  return m;
}